

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nes_system.c
# Opt level: O2

int nes_system_save_state(nes_system *system,void *buffer,size_t buffer_size)

{
  bool bVar1;
  uint uVar2;
  
  uVar2 = 0;
  if (buffer != (void *)0x0) {
    bVar1 = system->cartridge->mapper->state_size + 0x69ac <= buffer_size;
    if (bVar1) {
      memcpy(buffer,system,0x69ac);
      memcpy((void *)((long)buffer + 0x69ac),system->cartridge->mapper_state,
             system->cartridge->mapper->state_size);
    }
    uVar2 = (uint)bVar1;
  }
  return uVar2;
}

Assistant:

int nes_system_save_state(nes_system* system, void* buffer, size_t buffer_size)
{
    size_t state_size = nes_system_get_state_size(system);
    
    if (buffer && buffer_size >= state_size)
    {
        memcpy(buffer,                                   &system->state,                    sizeof(nes_system_state));
        memcpy((char*)buffer + sizeof(nes_system_state), system->cartridge->mapper_state,  system->cartridge->mapper->state_size);
        return 1;
    }

    return 0;
}